

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall
kratos::VarSlice::to_string_abi_cxx11_(string *__return_storage_ptr__,VarSlice *this)

{
  int iVar1;
  remove_reference_t<const_unsigned_int_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  string local_180 [32];
  string *local_160;
  string *parent_name;
  VarSlice *this_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_148;
  basic_string_view<char> local_138;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  local_128;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_100;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *vargs;
  string *local_f0;
  char *local_e8;
  string *local_e0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_d8;
  basic_string_view<char> local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int,_const_unsigned_int>
  local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int,_const_unsigned_int>
  *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int,_const_unsigned_int>
  *vargs_1;
  uint32_t *local_78;
  string *local_70;
  char *local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int,_const_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int,_const_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int,_const_unsigned_int>
  *local_10;
  
  parent_name = (string *)this;
  this_local = (VarSlice *)__return_storage_ptr__;
  (*(this->parent_var->super_IRNode)._vptr_IRNode[0x1f])(local_180);
  local_160 = local_180;
  if (this->high == this->low) {
    if (this->high == 0) {
      iVar1 = (*(this->parent_var->super_IRNode)._vptr_IRNode[7])();
      if (iVar1 == 1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,local_160);
        goto LAB_0020ca2a;
      }
    }
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int>
             *)&this->high;
    local_e8 = "{0}[{1}]";
    local_f0 = local_160;
    local_e0 = __return_storage_ptr__;
    fmt::v7::make_args_checked<std::__cxx11::string_const&,unsigned_int_const&,char[9],char>
              (&local_128,(v7 *)"{0}[{1}]",(char (*) [9])local_160,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
    local_100 = &local_128;
    local_138 = fmt::v7::to_string_view<char,_0>(local_e8);
    local_50 = &local_148;
    local_58 = local_100;
    local_48 = local_100;
    local_38 = local_100;
    local_40 = local_50;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,0x2d,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_100);
    format_str.size_ = local_148.desc_;
    format_str.data_ = (char *)local_138.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_148.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_138.data_,format_str,args);
  }
  else {
    local_78 = &this->high;
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_unsigned_int,_const_unsigned_int>
               *)&this->low;
    local_68 = "{0}[{1}:{2}]";
    local_70 = local_160;
    local_60 = __return_storage_ptr__;
    fmt::v7::
    make_args_checked<std::__cxx11::string_const&,unsigned_int_const&,unsigned_int_const&,char[13],char>
              (&local_b8,(v7 *)"{0}[{1}:{2}]",(char (*) [13])local_160,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)local_78,
               (remove_reference_t<const_unsigned_int_&> *)vargs_1,
               (remove_reference_t<const_unsigned_int_&> *)in_R9.values_);
    local_88 = &local_b8;
    local_c8 = fmt::v7::to_string_view<char,_0>(local_68);
    local_28 = &local_d8;
    local_30 = local_88;
    local_20 = local_88;
    local_10 = local_88;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x22d,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_88);
    format_str_00.size_ = local_d8.desc_;
    format_str_00.data_ = (char *)local_c8.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_d8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_c8.data_,format_str_00,args_00);
  }
LAB_0020ca2a:
  std::__cxx11::string::~string(local_180);
  return __return_storage_ptr__;
}

Assistant:

std::string VarSlice::to_string() const {
    auto const &parent_name = parent_var->to_string();
    if (high == low) {
        if (high == 0 && parent_var->width() == 1) {
            return parent_name;
        }
        return ::format("{0}[{1}]", parent_name, high);
    } else {
        return ::format("{0}[{1}:{2}]", parent_name, high, low);
    }
}